

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uchar * print(cJSON *item,cJSON_bool format,internal_hooks *hooks)

{
  cJSON_bool cVar1;
  uchar *puVar2;
  ulong __n;
  printbuffer local_58;
  
  local_58.noalloc = 0;
  local_58.format = 0;
  local_58.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_58.offset = 0;
  local_58.depth = 0;
  local_58.buffer = (uchar *)(*global_hooks.allocate)(0x100);
  local_58.length = 0x100;
  local_58.format = format;
  local_58.hooks.allocate = global_hooks.allocate;
  local_58.hooks.deallocate = global_hooks.deallocate;
  local_58.hooks.reallocate = global_hooks.reallocate;
  if ((local_58.buffer != (uchar *)0x0) && (cVar1 = print_value(item,&local_58), cVar1 != 0)) {
    update_offset(&local_58);
    if (global_hooks.reallocate == (_func_void_ptr_void_ptr_size_t *)0x0) {
      puVar2 = (uchar *)(*global_hooks.allocate)(local_58.offset + 1);
      if (puVar2 != (uchar *)0x0) {
        __n = local_58.offset + 1;
        if (local_58.length < local_58.offset + 1) {
          __n = local_58.length;
        }
        memcpy(puVar2,local_58.buffer,__n);
        puVar2[local_58.offset] = '\0';
        (*global_hooks.deallocate)(local_58.buffer);
        return puVar2;
      }
    }
    else {
      puVar2 = (uchar *)(*global_hooks.reallocate)(local_58.buffer,local_58.offset + 1);
      if (puVar2 != (uchar *)0x0) {
        return puVar2;
      }
    }
  }
  if (local_58.buffer != (uchar *)0x0) {
    (*global_hooks.deallocate)(local_58.buffer);
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char *print(const cJSON * const item, cJSON_bool format, const internal_hooks * const hooks)
{
    static const size_t default_buffer_size = 256;
    printbuffer buffer[1];
    unsigned char *printed = NULL;

    memset(buffer, 0, sizeof(buffer));

    /* create buffer */
    buffer->buffer = (unsigned char*) hooks->allocate(default_buffer_size);
    buffer->length = default_buffer_size;
    buffer->format = format;
    buffer->hooks = *hooks;
    if (buffer->buffer == NULL)
    {
        goto fail;
    }

    /* print the value */
    if (!print_value(item, buffer))
    {
        goto fail;
    }
    update_offset(buffer);

    /* check if reallocate is available */
    if (hooks->reallocate != NULL)
    {
        printed = (unsigned char*) hooks->reallocate(buffer->buffer, buffer->offset + 1);
        if (printed == NULL) {
            goto fail;
        }
        buffer->buffer = NULL;
    }
    else /* otherwise copy the JSON over to a new buffer */
    {
        printed = (unsigned char*) hooks->allocate(buffer->offset + 1);
        if (printed == NULL)
        {
            goto fail;
        }
        memcpy(printed, buffer->buffer, cjson_min(buffer->length, buffer->offset + 1));
        printed[buffer->offset] = '\0'; /* just to be sure */

        /* free the buffer */
        hooks->deallocate(buffer->buffer);
    }

    return printed;

fail:
    if (buffer->buffer != NULL)
    {
        hooks->deallocate(buffer->buffer);
    }

    if (printed != NULL)
    {
        hooks->deallocate(printed);
    }

    return NULL;
}